

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int __errnum;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  ulong uVar6;
  string local_900 [32];
  string local_8e0;
  undefined1 local_8c0 [8];
  ostringstream cmCPackLog_msg_3;
  string local_748;
  string local_728 [32];
  undefined1 local_708 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_590 [8];
  string rp;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_529;
  string local_528;
  cmValue local_508;
  cmValue installPrefix;
  allocator<char> local_4c9;
  string local_4c8;
  string *local_4a8;
  cmAlphaNum local_4a0;
  string local_470;
  allocator<char> local_449;
  string local_448;
  undefined1 local_428 [8];
  string filePrefix;
  string local_400 [32];
  undefined1 local_3e0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_268 [8];
  cmWorkingDirectory workdir;
  allocator<char> local_219;
  string local_218;
  cmValue local_1f8;
  undefined1 local_1f0 [8];
  string localToplevel;
  ostringstream local_1a0 [8];
  ostringstream cmCPackLog_msg;
  cmCPackComponent *component_local;
  cmArchiveWrite *archive_local;
  cmCPackArchiveGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"   - packaging component: ");
  poVar3 = std::operator<<(poVar3,(string *)component);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x74,pcVar4);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"CPACK_TEMPORARY_DIRECTORY",&local_219);
  local_1f8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_218);
  psVar5 = cmValue::operator_cast_to_string_(&local_1f8);
  std::__cxx11::string::string((string *)local_1f0,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &workdir.ResultCode,"/",&component->Name);
  std::__cxx11::string::operator+=((string *)local_1f0,(string *)&workdir.ResultCode);
  std::__cxx11::string::~string((string *)&workdir.ResultCode);
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_268,(string *)local_1f0);
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_268);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    poVar3 = std::operator<<((ostream *)local_3e0,"Failed to change working directory to ");
    poVar3 = std::operator<<(poVar3,(string *)local_1f0);
    poVar3 = std::operator<<(poVar3," : ");
    __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_268);
    pcVar4 = strerror(__errnum);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x7e,pcVar4);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    this_local._4_4_ = 0;
    filePrefix.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_428);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",&local_449);
    bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"CPACK_PACKAGE_FILE_NAME",&local_4c9);
      local_4a8 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4c8);
      cmAlphaNum::cmAlphaNum(&local_4a0,(cmValue)local_4a8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&installPrefix,'/');
      cmStrCat<>(&local_470,&local_4a0,(cmAlphaNum *)&installPrefix);
      std::__cxx11::string::operator=((string *)local_428,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"CPACK_PACKAGING_INSTALL_PREFIX",&local_529);
    local_508 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
    bVar2 = cmValue::operator_cast_to_bool(&local_508);
    if (bVar2) {
      cmValue::operator->[abi_cxx11_(&local_508);
      uVar6 = std::__cxx11::string::size();
      if (1 < uVar6) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_508);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
        if (*pcVar4 == '/') {
          psVar5 = cmValue::operator->[abi_cxx11_(&local_508);
          std::__cxx11::string::substr((ulong)&__range1,(ulong)psVar5);
          std::__cxx11::string::operator+=((string *)local_428,(string *)&__range1);
          std::__cxx11::string::~string((string *)&__range1);
          std::__cxx11::string::operator+=((string *)local_428,"/");
        }
      }
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&component->Files);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&component->Files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      rp.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rp.field_2._8_8_);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
      poVar3 = std::operator<<((ostream *)local_708,"Adding file: ");
      poVar3 = std::operator<<(poVar3,(string *)local_590);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x8e,pcVar4);
      std::__cxx11::string::~string(local_728);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
      std::__cxx11::string::string((string *)&local_748,(string *)local_590);
      cmArchiveWrite::Add(archive,&local_748,0,(char *)0x0,false);
      std::__cxx11::string::~string((string *)&local_748);
      bVar2 = cmArchiveWrite::operator!(archive);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
        poVar3 = std::operator<<((ostream *)local_8c0,"ERROR while packaging files: ");
        cmArchiveWrite::GetError_abi_cxx11_(&local_8e0,archive);
        poVar3 = std::operator<<(poVar3,(string *)&local_8e0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_8e0);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x93,pcVar4);
        std::__cxx11::string::~string(local_900);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
        this_local._4_4_ = 0;
      }
      filePrefix.field_2._13_3_ = 0;
      filePrefix.field_2._M_local_buf[0xc] = bVar2;
      std::__cxx11::string::~string((string *)local_590);
      if (filePrefix.field_2._12_4_ != 0) goto LAB_001cfa02;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = 1;
    filePrefix.field_2._12_4_ = 1;
LAB_001cfa02:
    std::__cxx11::string::~string((string *)local_428);
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_268);
  std::__cxx11::string::~string((string *)local_1f0);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << localToplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = cmStrCat(this->GetOption("CPACK_PACKAGE_FILE_NAME"), '/');
  }
  cmValue installPrefix = this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix->size() > 1 &&
      (*installPrefix)[0] == '/') {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix->substr(1);
    filePrefix += "/";
  }
  for (std::string const& file : component->Files) {
    std::string rp = filePrefix + file;
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
    archive.Add(rp, 0, nullptr, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR while packaging files: " << archive.GetError()
                                                    << std::endl);
      return 0;
    }
  }
  return 1;
}